

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O1

ssize_t __thiscall input_mod::read(input_mod *this,int __fd,void *__buf,size_t __nbytes)

{
  FCriticalSection *this_00;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  void *buffer;
  ulong __n;
  undefined4 in_register_00000034;
  ulong unaff_R12;
  undefined7 uVar4;
  
  buffer = (void *)CONCAT44(in_register_00000034,__fd);
  __n = (ulong)__buf & 0xffffffff;
  if (*(char *)(__nbytes + 0x60) == '\x01') {
    unaff_R12 = 0;
    memset(buffer,0,(long)(int)__buf);
  }
  else {
    this_00 = (FCriticalSection *)(__nbytes + 0x80);
    FCriticalSection::Enter(this_00);
    do {
      uVar4 = (undefined7)(unaff_R12 >> 8);
      if ((int)__n < 1) {
        FCriticalSection::Leave(this_00);
        unaff_R12 = CONCAT71(uVar4,1);
        break;
      }
      iVar2 = decode_run((input_mod *)__nbytes,buffer,(uint)(__n >> 3));
      if (iVar2 < 0) {
        FCriticalSection::Leave(this_00);
        bVar1 = false;
        unaff_R12 = 0;
      }
      else if (iVar2 == 0) {
        FCriticalSection::Leave(this_00);
        bVar1 = false;
        memset(buffer,0,__n);
        unaff_R12 = CONCAT71(uVar4,1);
      }
      else {
        uVar3 = 0;
        do {
          *(float *)((long)buffer + uVar3 * 4) =
               (float)*(int *)((long)buffer + uVar3 * 4) * 5.9604645e-08 *
               mod_dumb_mastervolume.Value;
          uVar3 = uVar3 + 1;
        } while ((uint)(iVar2 * 2) != uVar3);
        buffer = (void *)((long)buffer + (ulong)(uint)(iVar2 * 8));
        __n = (ulong)(uint)((int)__n + iVar2 * -8);
        bVar1 = true;
      }
    } while (bVar1);
  }
  return unaff_R12 & 0xffffff01;
}

Assistant:

bool input_mod::read(SoundStream *stream, void *buffer, int sizebytes, void *userdata)
{
	input_mod *state = (input_mod *)userdata;
	if (state->eof)
	{
		memset(buffer, 0, sizebytes);
		return false;
	}
	state->crit_sec.Enter();
	while (sizebytes > 0)
	{
		int written = state->decode_run(buffer, sizebytes / 8);
		if (written < 0)
		{
			state->crit_sec.Leave();
			return false;
		}
		if (written == 0)
		{
			state->crit_sec.Leave();
			memset(buffer, 0, sizebytes);
			return true;
		}
		else
		{
			// Convert to float
			for (int i = 0; i < written * 2; ++i)
			{
				((float *)buffer)[i] = (((int *)buffer)[i] / (float)(1 << 24)) * mod_dumb_mastervolume;
			}
		}
		buffer = (BYTE *)buffer + written * 8;
		sizebytes -= written * 8;
	}
	state->crit_sec.Leave();
	return true;
}